

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.c
# Opt level: O0

IXML_NodeList *
ixmlElement_getElementsByTagNameNS(IXML_Element *element,char *namespaceURI,char *localName)

{
  IXML_NodeList *local_30;
  IXML_NodeList *nodeList;
  IXML_Node *node;
  char *localName_local;
  char *namespaceURI_local;
  IXML_Element *element_local;
  
  local_30 = (IXML_NodeList *)0x0;
  if (((element != (IXML_Element *)0x0) && (namespaceURI != (char *)0x0)) &&
     (localName != (char *)0x0)) {
    nodeList = (IXML_NodeList *)element;
    node = (IXML_Node *)localName;
    localName_local = namespaceURI;
    namespaceURI_local = (char *)element;
    ixmlNode_getElementsByTagNameNS(&element->n,namespaceURI,localName,&local_30);
  }
  return local_30;
}

Assistant:

IXML_NodeList *ixmlElement_getElementsByTagNameNS(IXML_Element *element,
	const DOMString namespaceURI,
	const DOMString localName)
{
	IXML_Node *node = (IXML_Node *)element;
	IXML_NodeList *nodeList = NULL;

	if (element != NULL && namespaceURI != NULL && localName != NULL) {
		ixmlNode_getElementsByTagNameNS(
			node, namespaceURI, localName, &nodeList);
	}

	return nodeList;
}